

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void reduce_script(j_compress_ptr cinfo)

{
  long lVar1;
  long in_RDI;
  int idxin;
  int idxout;
  jpeg_scan_info *scanptr;
  undefined4 local_18;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_RDI + 0x118);
  local_14 = 0;
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x110); local_18 = local_18 + 1) {
    if (local_18 != local_14) {
      memcpy((void *)(lVar1 + (long)local_14 * 0x24),(void *)(lVar1 + (long)local_18 * 0x24),0x24);
    }
    if (*(int *)(lVar1 + (long)local_14 * 0x24 + 0x14) <= *(int *)(in_RDI + 0x1e8)) {
      if (*(int *)(in_RDI + 0x1e8) < *(int *)(lVar1 + (long)local_14 * 0x24 + 0x18)) {
        *(undefined4 *)(lVar1 + (long)local_14 * 0x24 + 0x18) = *(undefined4 *)(in_RDI + 0x1e8);
      }
      local_14 = local_14 + 1;
    }
  }
  *(int *)(in_RDI + 0x110) = local_14;
  return;
}

Assistant:

LOCAL(void)
reduce_script (j_compress_ptr cinfo)
/* Adapt scan script for use with reduced block size;
 * assume that script has been validated before.
 */
{
  jpeg_scan_info * scanptr;
  int idxout, idxin;

  /* Circumvent const declaration for this function */
  scanptr = (jpeg_scan_info *) cinfo->scan_info;
  idxout = 0;

  for (idxin = 0; idxin < cinfo->num_scans; idxin++) {
    /* After skipping, idxout becomes smaller than idxin */
    if (idxin != idxout)
      /* Copy rest of data;
       * note we stay in given chunk of allocated memory.
       */
      scanptr[idxout] = scanptr[idxin];
    if (scanptr[idxout].Ss > cinfo->lim_Se)
      /* Entire scan out of range - skip this entry */
      continue;
    if (scanptr[idxout].Se > cinfo->lim_Se)
      /* Limit scan to end of block */
      scanptr[idxout].Se = cinfo->lim_Se;
    idxout++;
  }

  cinfo->num_scans = idxout;
}